

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O2

void duckdb::PragmaTableInfoFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  CatalogType CVar1;
  char cVar2;
  TableCatalogEntry *this;
  ColumnConstraintInfo constraint_info;
  FunctionData *pFVar3;
  GlobalTableFunctionState *pGVar4;
  ColumnList *pCVar5;
  _func_int **pp_Var6;
  ColumnDefinition *column;
  _func_int **pp_Var7;
  reference other;
  reference name;
  NotImplementedException *this_00;
  idx_t i;
  LogicalIndex idx;
  _func_int **pp_Var8;
  __node_base *this_01;
  idx_t iVar9;
  allocator local_71;
  DataChunk *local_70;
  size_t *local_68;
  __node_base *local_60;
  __node_base *local_58;
  string local_50;
  
  local_70 = output;
  pFVar3 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
  pGVar4 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  this = (TableCatalogEntry *)pFVar3[4]._vptr_FunctionData;
  CVar1 = (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type;
  if (CVar1 == VIEW_ENTRY) {
    pp_Var8 = pGVar4[1]._vptr_GlobalTableFunctionState;
    pp_Var7 = (_func_int **)
              ((long)((long)(this->columns).name_map._M_h._M_single_bucket -
                     (this->columns).name_map._M_h._M_rehash_policy._M_next_resize) / 0x18);
    if (pp_Var8 < pp_Var7) {
      cVar2 = *(char *)&pFVar3[5]._vptr_FunctionData;
      local_68 = &(this->columns).name_map._M_h._M_rehash_policy._M_next_resize;
      if (pp_Var8 + 0x100 < pp_Var7) {
        pp_Var7 = pp_Var8 + 0x100;
      }
      local_70->count = (long)pp_Var7 - (long)pp_Var8;
      local_58 = &(this->columns).name_map._M_h._M_before_begin;
      local_60 = (__node_base *)
                 ((long)&(this->columns).physical_columns.
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data + 8);
      for (; pp_Var8 < pp_Var7; pp_Var8 = (_func_int **)((long)pp_Var8 + 1)) {
        iVar9 = (long)pp_Var8 - (long)pGVar4[1]._vptr_GlobalTableFunctionState;
        other = vector<duckdb::LogicalType,_true>::get<true>
                          ((vector<duckdb::LogicalType,_true> *)local_68,(size_type)pp_Var8);
        LogicalType::LogicalType((LogicalType *)&local_50,other);
        this_01 = local_60;
        if (pp_Var8 < (_func_int **)
                      ((long)((this->columns).name_map._M_h._M_element_count -
                             (long)(this->columns).name_map._M_h._M_before_begin._M_nxt) >> 5)) {
          this_01 = local_58;
        }
        name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)this_01,(size_type)pp_Var8);
        if (cVar2 == '\0') {
          PragmaShowHelper::GetViewColumns
                    ((idx_t)pp_Var8,name,(LogicalType *)&local_50,local_70,iVar9);
        }
        else {
          PragmaTableInfoHelper::GetViewColumns
                    ((idx_t)pp_Var8,name,(LogicalType *)&local_50,local_70,iVar9);
        }
        LogicalType::~LogicalType((LogicalType *)&local_50);
      }
      pGVar4[1]._vptr_GlobalTableFunctionState = pp_Var7;
    }
  }
  else {
    if (CVar1 != TABLE_ENTRY) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Unimplemented catalog type for pragma_table_info",&local_71);
      NotImplementedException::NotImplementedException(this_00,&local_50);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_68 = (size_t *)CONCAT71(local_68._1_7_,*(undefined1 *)&pFVar3[5]._vptr_FunctionData);
    pp_Var8 = pGVar4[1]._vptr_GlobalTableFunctionState;
    pCVar5 = TableCatalogEntry::GetColumns(this);
    if (pp_Var8 < (_func_int **)
                  (((long)(pCVar5->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar5->columns).
                         super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                         .
                         super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0xd8)) {
      pp_Var8 = pGVar4[1]._vptr_GlobalTableFunctionState;
      pCVar5 = TableCatalogEntry::GetColumns(this);
      pp_Var6 = (_func_int **)
                (((long)(pCVar5->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pCVar5->columns).
                       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                       .
                       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xd8);
      pp_Var7 = pp_Var8 + 0x100;
      if (pp_Var6 <= pp_Var8 + 0x100) {
        pp_Var7 = pp_Var6;
      }
      idx.index = (idx_t)pGVar4[1]._vptr_GlobalTableFunctionState;
      local_70->count = (long)pp_Var7 - idx.index;
      for (; idx.index < pp_Var7; idx.index = idx.index + 1) {
        iVar9 = idx.index - (long)pGVar4[1]._vptr_GlobalTableFunctionState;
        column = TableCatalogEntry::GetColumn(this,idx);
        constraint_info = CheckConstraints(this,column);
        if ((char)local_68 == '\0') {
          PragmaShowHelper::GetTableColumns(column,constraint_info,local_70,iVar9);
        }
        else {
          PragmaTableInfoHelper::GetTableColumns(column,constraint_info,local_70,iVar9);
        }
      }
      pGVar4[1]._vptr_GlobalTableFunctionState = pp_Var7;
    }
  }
  return;
}

Assistant:

static void PragmaTableInfoFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<PragmaTableFunctionData>();
	auto &state = data_p.global_state->Cast<PragmaTableOperatorData>();
	switch (bind_data.entry.type) {
	case CatalogType::TABLE_ENTRY:
		PragmaTableInfoTable(state, bind_data.entry.Cast<TableCatalogEntry>(), output, bind_data.is_table_info);
		break;
	case CatalogType::VIEW_ENTRY:
		PragmaTableInfoView(state, bind_data.entry.Cast<ViewCatalogEntry>(), output, bind_data.is_table_info);
		break;
	default:
		throw NotImplementedException("Unimplemented catalog type for pragma_table_info");
	}
}